

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_access.c
# Opt level: O1

ecs_entity_t * get_entity_array(ecs_table_t *table,int32_t row)

{
  ecs_vector_t *vector;
  void *pvVar1;
  
  _ecs_assert(table != (ecs_table_t *)0x0,0xc,(char *)0x0,"table != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/direct_access.c"
              ,0x2d);
  if (table == (ecs_table_t *)0x0) {
    __assert_fail("table != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/direct_access.c"
                  ,0x2d,"ecs_entity_t *get_entity_array(ecs_table_t *, int32_t)");
  }
  _ecs_assert(table->data != (ecs_data_t *)0x0,0xc,(char *)0x0,"table->data != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/direct_access.c"
              ,0x2e);
  if (table->data != (ecs_data_t *)0x0) {
    _ecs_assert(table->data->entities != (ecs_vector_t *)0x0,0xc,(char *)0x0,
                "table->data->entities != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/direct_access.c"
                ,0x2f);
    vector = table->data->entities;
    if (vector != (ecs_vector_t *)0x0) {
      pvVar1 = _ecs_vector_first(vector,8,0x10);
      return (ecs_entity_t *)((long)pvVar1 + (long)row * 8);
    }
    __assert_fail("table->data->entities != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/direct_access.c"
                  ,0x2f,"ecs_entity_t *get_entity_array(ecs_table_t *, int32_t)");
  }
  __assert_fail("table->data != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/direct_access.c"
                ,0x2e,"ecs_entity_t *get_entity_array(ecs_table_t *, int32_t)");
}

Assistant:

static
ecs_entity_t* get_entity_array(
    ecs_table_t *table,
    int32_t row)
{
    ecs_assert(table != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(table->data != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(table->data->entities != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_entity_t *array = ecs_vector_first(table->data->entities, ecs_entity_t);
    return &array[row];
}